

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::end_query(NegativeTestContext *ctx)

{
  allocator<char> local_35;
  GLuint id;
  string local_30;
  
  id = 0;
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,1,&id);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_35);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0xffffffff);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if ctx.glEndQuery is executed when a query object of the same target is not active."
             ,&local_35);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,id);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c88);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteQueries(&ctx->super_CallLogWrapper,1,&id);
  NegativeTestContext::expectError(ctx,0);
  return;
}

Assistant:

void end_query (NegativeTestContext& ctx)
{
	GLuint id = 0;
	ctx.glGenQueries	(1, &id);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glEndQuery		(-1);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glEndQuery is executed when a query object of the same target is not active.");
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, id);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glEndQuery		(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_NO_ERROR);
	ctx.endSection();

	ctx.glDeleteQueries	(1, &id);
	ctx.expectError		(GL_NO_ERROR);
}